

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O0

int CfdGetTxInfo(void *handle,int net_type,char *tx_hex_string,char **txid,char **wtxid,
                uint32_t *size,uint32_t *vsize,uint32_t *weight,uint32_t *version,uint32_t *locktime
                )

{
  bool bVar1;
  undefined8 uVar2;
  long *in_RCX;
  char *in_RDX;
  long *in_R8;
  ConfidentialTransactionContext *in_stack_00000020;
  CfdException *except;
  exception *std_except;
  ConfidentialTransactionContext tx_1;
  TransactionContext tx;
  bool is_bitcoin;
  char *work_wtxid;
  char *work_txid;
  int result;
  string *in_stack_fffffffffffffd38;
  ConfidentialTransactionContext *in_stack_fffffffffffffd40;
  string *in_stack_fffffffffffffd50;
  undefined8 in_stack_fffffffffffffd58;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffd60;
  allocator *paVar3;
  bool *in_stack_fffffffffffffd98;
  int in_stack_fffffffffffffda4;
  string local_258 [80];
  uint32_t *in_stack_fffffffffffffdf8;
  uint32_t *in_stack_fffffffffffffe00;
  uint32_t *in_stack_fffffffffffffe08;
  char **in_stack_fffffffffffffe10;
  char **in_stack_fffffffffffffe18;
  AbstractTransaction *in_stack_fffffffffffffe20;
  uint32_t *in_stack_fffffffffffffe30;
  uint32_t *in_stack_fffffffffffffe38;
  allocator local_179;
  string local_178 [221];
  byte local_9b;
  undefined1 local_9a;
  allocator local_99;
  string local_98 [32];
  CfdSourceLocation local_78;
  long local_50;
  long local_48;
  undefined4 local_3c;
  long *local_30;
  long *local_28;
  char *local_20;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffd58 >> 0x20);
  local_3c = 0xffffffff;
  local_48 = 0;
  local_50 = 0;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(local_20);
  if (!bVar1) {
    local_9b = 0;
    cfd::capi::ConvertNetType(in_stack_fffffffffffffda4,in_stack_fffffffffffffd98);
    if ((local_9b & 1) == 0) {
      paVar3 = (allocator *)&stack0xfffffffffffffda7;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_258,local_20,paVar3);
      cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
                (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
      std::__cxx11::string::~string(local_258);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffda7);
      cfd::capi::GetTxInfo
                (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                 in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                 in_stack_fffffffffffffe30,in_stack_fffffffffffffe38);
      cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(in_stack_00000020);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_178,local_20,&local_179);
      cfd::TransactionContext::TransactionContext
                ((TransactionContext *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
      std::__cxx11::string::~string(local_178);
      std::allocator<char>::~allocator((allocator<char> *)&local_179);
      cfd::capi::GetTxInfo
                (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                 in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                 in_stack_fffffffffffffe30,in_stack_fffffffffffffe38);
      cfd::TransactionContext::~TransactionContext((TransactionContext *)in_stack_00000020);
    }
    if (local_48 != 0) {
      *local_28 = local_48;
    }
    if (local_50 != 0) {
      *local_30 = local_50;
    }
    return 0;
  }
  local_78.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
               ,0x2f);
  local_78.filename = local_78.filename + 1;
  local_78.line = 0x987;
  local_78.funcname = "CfdGetTxInfo";
  cfd::core::logger::warn<>(&local_78,"tx is null or empty.");
  local_9a = 1;
  uVar2 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"Failed to parameter. tx is null or empty.",&local_99);
  cfd::core::CfdException::CfdException
            (in_stack_fffffffffffffd60,error_code,in_stack_fffffffffffffd50);
  local_9a = 0;
  __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetTxInfo(
    void* handle, int net_type, const char* tx_hex_string, char** txid,
    char** wtxid, uint32_t* size, uint32_t* vsize, uint32_t* weight,
    uint32_t* version, uint32_t* locktime) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_txid = nullptr;
  char* work_wtxid = nullptr;
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }

    bool is_bitcoin = false;
    ConvertNetType(net_type, &is_bitcoin);
    if (is_bitcoin) {
      TransactionContext tx(tx_hex_string);
      GetTxInfo(
          &tx, &work_txid, &work_wtxid, size, vsize, weight, version,
          locktime);
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext tx(tx_hex_string);
      GetTxInfo(
          &tx, &work_txid, &work_wtxid, size, vsize, weight, version,
          locktime);
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    if (work_txid != nullptr) *txid = work_txid;
    if (work_wtxid != nullptr) *wtxid = work_wtxid;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_txid, &work_wtxid);
  return result;
}